

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonLabelCompare(char *zLeft,u32 nLeft,int rawLeft,char *zRight,u32 nRight,int rawRight)

{
  byte bVar1;
  int iVar2;
  u32 uVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  uint uVar6;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT71((int7)((ulong)in_RAX >> 8),rawLeft == 0);
  if (rawRight != 0 && rawLeft != 0) {
    uVar4 = 0;
    if (nLeft == nRight) {
      iVar2 = bcmp(zLeft,zRight,(ulong)nLeft);
      uVar4 = (uint)(iVar2 == 0);
    }
    return uVar4;
  }
  do {
    if (nLeft == 0) {
      uStack_38 = (ulong)uStack_38._4_4_ << 0x20;
      nLeft = 0;
    }
    else {
      bVar1 = *zLeft;
      if ((rawLeft == 0) && (bVar1 == 0x5c)) {
        uVar3 = jsonUnescapeOneChar(zLeft,nLeft,(u32 *)&uStack_38);
        zLeft = (char *)((byte *)zLeft + uVar3);
        nLeft = nLeft - uVar3;
      }
      else {
        uStack_38 = CONCAT44(uStack_38._4_4_,(uint)bVar1);
        if (bVar1 < 0xc0) {
          zLeft = (char *)((byte *)zLeft + 1);
          nLeft = nLeft - 1;
        }
        else {
          bVar1 = *zLeft;
          uVar4 = (uint)bVar1;
          uVar5 = 1;
          if (0xbf < bVar1) {
            uVar4 = (uint)""[bVar1 - 0xc0];
            uVar6 = 4;
            if ((int)nLeft < 4) {
              uVar6 = nLeft;
            }
            if (1 < (int)nLeft) {
              uVar5 = 1;
              do {
                if ((((byte *)zLeft)[uVar5] & 0xffffffc0) != 0x80) goto LAB_001aa8bd;
                uVar4 = ((byte *)zLeft)[uVar5] & 0x3f | uVar4 << 6;
                uVar5 = uVar5 + 1;
              } while (uVar6 != uVar5);
              uVar5 = (ulong)uVar6;
            }
          }
LAB_001aa8bd:
          uStack_38 = CONCAT44(uStack_38._4_4_,uVar4);
          zLeft = (char *)((byte *)zLeft + (int)uVar5);
          nLeft = nLeft - (int)uVar5;
        }
      }
    }
    uVar3 = (u32)uStack_38;
    if (nRight == 0) {
      return (uint)((u32)uStack_38 == 0);
    }
    bVar1 = *zRight;
    if ((rawRight == 0) && (bVar1 == 0x5c)) {
      uVar3 = jsonUnescapeOneChar(zRight,nRight,(u32 *)((long)&uStack_38 + 4));
      zRight = (char *)((byte *)zRight + uVar3);
      nRight = nRight - uVar3;
      uVar4 = uStack_38._4_4_;
    }
    else {
      uVar4 = (uint)bVar1;
      uStack_38 = (ulong)CONCAT14(bVar1,(u32)uStack_38);
      if (bVar1 < 0xc0) {
        zRight = (char *)((byte *)zRight + 1);
        nRight = nRight - 1;
      }
      else {
        bVar1 = *zRight;
        uVar4 = (uint)bVar1;
        uVar5 = 1;
        if (0xbf < bVar1) {
          uVar4 = (uint)""[bVar1 - 0xc0];
          uVar6 = 4;
          if ((int)nRight < 4) {
            uVar6 = nRight;
          }
          if (1 < (int)nRight) {
            uVar5 = 1;
            do {
              if ((((byte *)zRight)[uVar5] & 0xffffffc0) != 0x80) goto LAB_001aa975;
              uVar4 = ((byte *)zRight)[uVar5] & 0x3f | uVar4 << 6;
              uVar5 = uVar5 + 1;
            } while (uVar6 != uVar5);
            uVar5 = (ulong)uVar6;
          }
        }
LAB_001aa975:
        uStack_38 = CONCAT44(uVar4,uVar3);
        zRight = (char *)((byte *)zRight + (int)uVar5);
        nRight = nRight - (int)uVar5;
      }
    }
    if ((u32)uStack_38 != uVar4) {
      return 0;
    }
    if (uVar4 == 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int jsonLabelCompare(
  const char *zLeft,          /* The left label */
  u32 nLeft,                  /* Size of the left label in bytes */
  int rawLeft,                /* True if zLeft contains no escapes */
  const char *zRight,         /* The right label */
  u32 nRight,                 /* Size of the right label in bytes */
  int rawRight                /* True if zRight is escape-free */
){
  if( rawLeft && rawRight ){
    /* Simpliest case:  Neither label contains escapes.  A simple
    ** memcmp() is sufficient. */
    if( nLeft!=nRight ) return 0;
    return memcmp(zLeft, zRight, nLeft)==0;
  }else{
    return jsonLabelCompareEscaped(zLeft, nLeft, rawLeft,
                                   zRight, nRight, rawRight);
  }
}